

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

void __thiscall CVmObjFile::load_image_data(CVmObjFile *this,char *ptr,size_t siz)

{
  char cVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  
  uVar3 = *(undefined4 *)ptr;
  cVar1 = ptr[4];
  cVar2 = ptr[5];
  uVar4 = *(uint *)(ptr + 6);
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  iVar5 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x28,this);
  pcVar6 = (char *)CONCAT44(extraout_var,iVar5);
  (this->super_CVmObject).ext_ = pcVar6;
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6[4] = '\0';
  pcVar6[5] = '\0';
  pcVar6[6] = '\0';
  pcVar6[7] = '\0';
  pcVar6 = (this->super_CVmObject).ext_;
  pcVar6[8] = '\0';
  pcVar6[9] = '\0';
  pcVar6[10] = '\0';
  pcVar6[0xb] = '\0';
  pcVar6[0xc] = '\0';
  pcVar6[0xd] = '\0';
  pcVar6[0xe] = '\0';
  pcVar6[0xf] = '\0';
  *(undefined4 *)((this->super_CVmObject).ext_ + 0x10) = uVar3;
  *(ulong *)((this->super_CVmObject).ext_ + 0x18) = (ulong)uVar4 | 1;
  (this->super_CVmObject).ext_[0x14] = cVar1;
  (this->super_CVmObject).ext_[0x15] = cVar2;
  pcVar6 = (this->super_CVmObject).ext_;
  pcVar6[0x20] = '\0';
  pcVar6[0x21] = '\0';
  pcVar6[0x22] = '\0';
  pcVar6[0x23] = '\0';
  pcVar6[0x24] = '\0';
  pcVar6[0x25] = '\0';
  pcVar6[0x26] = '\0';
  pcVar6[0x27] = '\0';
  return;
}

Assistant:

void CVmObjFile::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* read our character set */
    vm_obj_id_t charset = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    /* get the mode and access values */
    int mode = (unsigned char)*ptr++;
    int access = (unsigned char)*ptr++;

    /* get the flags */
    unsigned long flags = t3rp4u(ptr);

    /* 
     *   add in the out-of-sync flag, since we've restored the state from a
     *   past state and thus we're out of sync with the external file system
     *   environment 
     */
    flags |= VMOBJFILE_OUT_OF_SYNC;

    /* 
     *   Initialize our extension - we have no underlying network file
     *   descriptor or native file handle, since the file is out of sync by
     *   virtue of being loaded from a previously saved image state.  Note
     *   that we don't need a read buffer because the file is inherently out
     *   of sync and thus cannot be read.  
     */
    alloc_ext(vmg_ 0, charset, 0, flags, mode, access, FALSE);
}